

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O0

shared_ptr<libtorrent::torrent_info> __thiscall
libtorrent::torrent_handle::torrent_file_with_hashes(torrent_handle *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<libtorrent::torrent_info> *in_RSI;
  shared_ptr<libtorrent::torrent_info> sVar1;
  shared_ptr<libtorrent::torrent_info> local_28;
  torrent_handle *this_local;
  
  this_local = this;
  ::std::shared_ptr<libtorrent::torrent_info>::shared_ptr(&local_28);
  sync_call_ret<std::shared_ptr<libtorrent::torrent_info>,std::shared_ptr<libtorrent::torrent_info>(libtorrent::aux::torrent::*)()const>
            (this,in_RSI,(offset_in_torrent_to_subr)&local_28);
  ::std::shared_ptr<libtorrent::torrent_info>::~shared_ptr(&local_28);
  sVar1.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<libtorrent::torrent_info>)
         sVar1.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent_info> torrent_handle::torrent_file_with_hashes() const
	{
		return sync_call_ret<std::shared_ptr<torrent_info>>(
			std::shared_ptr<torrent_info>(), &aux::torrent::get_torrent_copy_with_hashes);
	}